

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

iterator __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *this,iterator it)

{
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> it_01;
  iterator iVar1;
  type tVar2;
  char cVar3;
  type arg_type;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *pbVar4;
  char *pcVar5;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *handler_00;
  null_terminating_iterator<char> it_02;
  arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_110;
  basic_buffer<char> *local_f0;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_e8;
  char *pcStack_e0;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_d8;
  char *local_d0;
  null_terminating_iterator<char> local_c8;
  specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_b8;
  undefined1 local_a8 [8];
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  handler;
  basic_format_specs<char> specs;
  custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_50;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_48;
  char *local_40;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *local_38;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *parse_ctx;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_local;
  iterator it_local;
  char *local_10;
  
  it_local.ptr_ = it.end_;
  this_local = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                *)it.ptr_;
  parse_ctx = (basic_parse_context<char,_fmt::v5::internal::error_handler> *)this;
  pbVar4 = internal::
           context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
           ::parse_context(&(this->context).
                            super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                          );
  local_48 = this_local;
  local_40 = it_local.ptr_;
  it_01.end_ = it_local.ptr_;
  it_01.ptr_ = (char *)this_local;
  local_38 = pbVar4;
  pcVar5 = internal::pointer_from<char>(it_01);
  basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to(pbVar4,pcVar5);
  internal::
  custom_formatter<char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::custom_formatter(&local_50,&this->context);
  tVar2 = visit<fmt::v5::internal::custom_formatter<char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                    (&local_50,this->arg);
  if (tVar2) {
    internal::null_terminating_iterator<char>::
    null_terminating_iterator<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>
              ((null_terminating_iterator<char> *)&it_local.end_,local_38);
  }
  else {
    handler_00 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                  *)0x20;
    basic_format_specs<char>::basic_format_specs
              ((basic_format_specs<char> *)&handler.arg_type_,0,'\0',L' ');
    internal::
    specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::specs_handler(&local_b8,(basic_format_specs<char> *)&handler.arg_type_,&this->context);
    arg_type = basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ::type(&this->arg);
    internal::
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::specs_checker((specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
                     *)local_a8,&local_b8,arg_type);
    local_d8 = this_local;
    local_d0 = it_local.ptr_;
    it_02.end_ = local_a8;
    it_02.ptr_ = it_local.ptr_;
    local_c8 = internal::
               parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                         ((internal *)this_local,it_02,handler_00);
    this_local = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  *)local_c8.ptr_;
    it_local.ptr_ = local_c8.end_;
    cVar3 = internal::null_terminating_iterator<char>::operator*
                      ((null_terminating_iterator<char> *)&this_local);
    if (cVar3 != '}') {
      internal::error_handler::on_error((error_handler *)this,"missing \'}\' in format string");
    }
    pbVar4 = local_38;
    local_e8 = this_local;
    pcStack_e0 = it_local.ptr_;
    it_00.end_ = it_local.ptr_;
    it_00.ptr_ = (char *)this_local;
    pcVar5 = internal::pointer_from<char>(it_00);
    basic_parse_context<char,_fmt::v5::internal::error_handler>::advance_to(pbVar4,pcVar5);
    arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    arg_formatter(&local_110,&this->context,(format_specs *)&handler.arg_type_);
    local_f0 = (basic_buffer<char> *)
               visit<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                         (&local_110,this->arg);
    internal::
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
    ::advance_to(&(this->context).
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 ,(iterator)local_f0);
    arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
    ~arg_formatter(&local_110);
    it_local.end_ = (char *)this_local;
    local_10 = it_local.ptr_;
  }
  iVar1.end_ = local_10;
  iVar1.ptr_ = it_local.end_;
  return iVar1;
}

Assistant:

iterator on_format_specs(iterator it) {
    auto& parse_ctx = context.parse_context();
    parse_ctx.advance_to(pointer_from(it));
    if (visit(internal::custom_formatter<Char, Context>(context), arg))
      return iterator(parse_ctx);
    basic_format_specs<Char> specs;
    using internal::specs_handler;
    internal::specs_checker<specs_handler<Context>>
        handler(specs_handler<Context>(specs, context), arg.type());
    it = parse_format_specs(it, handler);
    if (*it != '}')
      on_error("missing '}' in format string");
    parse_ctx.advance_to(pointer_from(it));
    context.advance_to(visit(ArgFormatter(context, specs), arg));
    return it;
  }